

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_shared_expressions.cpp
# Opt level: O1

void duckdb::WindowSharedExpressions::PrepareExecutors
               (Shared *shared,ExpressionExecutor *exec,DataChunk *chunk)

{
  Allocator *allocator;
  pointer poVar1;
  optional_ptr<const_duckdb::Expression,_true> expr;
  vector<duckdb::LogicalType,_true> types;
  vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_true> sorted;
  optional_ptr<const_duckdb::Expression,_true> local_70;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_68;
  vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_true> local_48;
  
  GetSortedExpressions(&local_48,shared);
  local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_48.
      super_vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_std::allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_>_>
      .
      super__Vector_base<duckdb::optional_ptr<const_duckdb::Expression,_true>,_std::allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super_vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_std::allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_>_>
      .
      super__Vector_base<duckdb::optional_ptr<const_duckdb::Expression,_true>,_std::allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    poVar1 = local_48.
             super_vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_std::allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_>_>
             .
             super__Vector_base<duckdb::optional_ptr<const_duckdb::Expression,_true>,_std::allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_70.ptr = poVar1->ptr;
      optional_ptr<const_duckdb::Expression,_true>::CheckValid(&local_70);
      ExpressionExecutor::AddExpression(exec,local_70.ptr);
      optional_ptr<const_duckdb::Expression,_true>::CheckValid(&local_70);
      ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
      emplace_back<duckdb::LogicalType_const&>
                ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_68,
                 &(local_70.ptr)->return_type);
      poVar1 = poVar1 + 1;
    } while (poVar1 != local_48.
                       super_vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_std::allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_>_>
                       .
                       super__Vector_base<duckdb::optional_ptr<const_duckdb::Expression,_true>,_std::allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_start !=
      local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    allocator = ExpressionExecutor::GetAllocator(exec);
    DataChunk::Initialize(chunk,allocator,(vector<duckdb::LogicalType,_true> *)&local_68,0x800);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_68);
  if (local_48.
      super_vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_std::allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_>_>
      .
      super__Vector_base<duckdb::optional_ptr<const_duckdb::Expression,_true>,_std::allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super_vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_std::allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_>_>
                    .
                    super__Vector_base<duckdb::optional_ptr<const_duckdb::Expression,_true>,_std::allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void WindowSharedExpressions::PrepareExecutors(Shared &shared, ExpressionExecutor &exec, DataChunk &chunk) {
	const auto sorted = GetSortedExpressions(shared);
	vector<LogicalType> types;
	for (auto expr : sorted) {
		exec.AddExpression(*expr);
		types.emplace_back(expr->return_type);
	}

	if (!types.empty()) {
		chunk.Initialize(exec.GetAllocator(), types);
	}
}